

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.hpp
# Opt level: O0

void __thiscall tcu::TestHierarchyIterator::NodeIter::setState(NodeIter *this,State newState)

{
  State newState_local;
  NodeIter *this_local;
  
  if (newState == STATE_TRAVERSE_CHILDREN) {
    this->curChildNdx = -1;
  }
  this->m_state = newState;
  return;
}

Assistant:

void setState (State newState)
		{
			switch (newState)
			{
				case STATE_TRAVERSE_CHILDREN:
					curChildNdx = -1;
					break;

				default:
					break;
			}

			m_state = newState;
		}